

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9MemObjInitFromInt(jx9_vm *pVm,jx9_value *pObj,sxi64 iVal)

{
  sxi32 extraout_EAX;
  
  SyZero(pObj,0x40);
  pObj->pVm = pVm;
  (pObj->sBlob).pBlob = (void *)0x0;
  (pObj->sBlob).nByte = 0;
  (pObj->sBlob).mByte = 0;
  (pObj->sBlob).pAllocator = &pVm->sAllocator;
  (pObj->sBlob).nFlags = 0;
  (pObj->x).iVal = iVal;
  pObj->iFlags = 2;
  return extraout_EAX;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjInitFromInt(jx9_vm *pVm, jx9_value *pObj, sxi64 iVal)
{
	/* Zero the structure */
	SyZero(pObj, sizeof(jx9_value));
	/* Initialize fields */
	pObj->pVm = pVm;
	SyBlobInit(&pObj->sBlob, &pVm->sAllocator);
	/* Set the desired type */
	pObj->x.iVal = iVal;
	pObj->iFlags = MEMOBJ_INT;
	return SXRET_OK;
}